

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O0

void __thiscall
CommandDrawSwitchableImage::CommandDrawSwitchableImage
          (CommandDrawSwitchableImage *this,SBarInfo *script)

{
  CommandDrawSwitchableImage *local_58;
  FString *local_30;
  SBarInfo *script_local;
  CommandDrawSwitchableImage *this_local;
  
  CommandDrawImage::CommandDrawImage(&this->super_CommandDrawImage,script);
  (this->super_CommandDrawImage).super_SBarInfoCommandFlowControl.super_SBarInfoCommand.
  _vptr_SBarInfoCommand = (_func_int **)&PTR__CommandDrawSwitchableImage_00b86230;
  this->condition = INVENTORY;
  this->conditionAnd = false;
  local_30 = this->inventoryItem;
  do {
    FString::FString(local_30);
    local_30 = local_30 + 1;
  } while (local_30 != (FString *)this->armorType);
  local_58 = (CommandDrawSwitchableImage *)this->keySpecies;
  do {
    FName::FName((FName *)local_58);
    local_58 = (CommandDrawSwitchableImage *)
               ((long)&(local_58->super_CommandDrawImage).super_SBarInfoCommandFlowControl.
                       super_SBarInfoCommand._vptr_SBarInfoCommand + 4);
  } while (local_58 != this + 1);
  this->conditionalImage[2] = -1;
  this->conditionalImage[1] = -1;
  this->conditionalImage[0] = -1;
  this->conditionalValue[1] = 0;
  this->conditionalValue[0] = 0;
  this->armorType[1] = 0;
  this->armorType[0] = 0;
  return;
}

Assistant:

CommandDrawSwitchableImage(SBarInfo *script) : CommandDrawImage(script),
			condition(INVENTORY), conditionAnd(false)
		{
			conditionalImage[0] = conditionalImage[1] = conditionalImage[2] = -1;
			conditionalValue[0] = conditionalValue[1] = 0;
			armorType[0] = armorType[1] = 0;
		}